

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCount(BtCursor *pCur,i64 *pnEntry)

{
  short sVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  MemPage *pMVar5;
  uint uVar6;
  i64 iVar7;
  
  if (pCur->pgnoRoot == 0) {
    *pnEntry = 0;
  }
  else {
    iVar4 = moveToRoot(pCur);
    iVar7 = 0;
    do {
      if (iVar4 != 0) {
        return iVar4;
      }
      pMVar5 = pCur->apPage[pCur->iPage];
      if ((pMVar5->leaf != '\0') || (pMVar5->intKey == '\0')) {
        iVar7 = iVar7 + (ulong)pMVar5->nCell;
      }
      if (pMVar5->leaf != '\0') {
        do {
          if (pCur->iPage == 0) {
            *pnEntry = iVar7;
            iVar4 = 0;
            bVar3 = false;
            goto LAB_0013eb55;
          }
          moveToParent(pCur);
          sVar1 = pCur->iPage;
        } while (pCur->apPage[sVar1]->nCell <= pCur->aiIdx[sVar1]);
        pCur->aiIdx[sVar1] = pCur->aiIdx[sVar1] + 1;
        pMVar5 = pCur->apPage[pCur->iPage];
      }
      uVar2 = pCur->aiIdx[pCur->iPage];
      if (uVar2 == pMVar5->nCell) {
        uVar6 = *(uint *)(pMVar5->aData + (ulong)pMVar5->hdrOffset + 8);
      }
      else {
        uVar6 = *(uint *)(pMVar5->aData +
                         (CONCAT11(pMVar5->aCellIdx[(ulong)uVar2 * 2],
                                   pMVar5->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar5->maskPage));
      }
      iVar4 = moveToChild(pCur,uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                               uVar6 << 0x18);
      bVar3 = true;
LAB_0013eb55:
    } while (bVar3);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCount(BtCursor *pCur, i64 *pnEntry){
  i64 nEntry = 0;                      /* Value to return in *pnEntry */
  int rc;                              /* Return code */

  if( pCur->pgnoRoot==0 ){
    *pnEntry = 0;
    return SQLITE_OK;
  }
  rc = moveToRoot(pCur);

  /* Unless an error occurs, the following loop runs one iteration for each
  ** page in the B-Tree structure (not including overflow pages). 
  */
  while( rc==SQLITE_OK ){
    int iIdx;                          /* Index of child node in parent */
    MemPage *pPage;                    /* Current page of the b-tree */

    /* If this is a leaf page or the tree is not an int-key tree, then 
    ** this page contains countable entries. Increment the entry counter
    ** accordingly.
    */
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->leaf || !pPage->intKey ){
      nEntry += pPage->nCell;
    }

    /* pPage is a leaf node. This loop navigates the cursor so that it 
    ** points to the first interior cell that it points to the parent of
    ** the next page in the tree that has not yet been visited. The
    ** pCur->aiIdx[pCur->iPage] value is set to the index of the parent cell
    ** of the page, or to the number of cells in the page if the next page
    ** to visit is the right-child of its parent.
    **
    ** If all pages in the tree have been visited, return SQLITE_OK to the
    ** caller.
    */
    if( pPage->leaf ){
      do {
        if( pCur->iPage==0 ){
          /* All pages of the b-tree have been visited. Return successfully. */
          *pnEntry = nEntry;
          return SQLITE_OK;
        }
        moveToParent(pCur);
      }while ( pCur->aiIdx[pCur->iPage]>=pCur->apPage[pCur->iPage]->nCell );

      pCur->aiIdx[pCur->iPage]++;
      pPage = pCur->apPage[pCur->iPage];
    }

    /* Descend to the child node of the cell that the cursor currently 
    ** points at. This is the right-child if (iIdx==pPage->nCell).
    */
    iIdx = pCur->aiIdx[pCur->iPage];
    if( iIdx==pPage->nCell ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
    }else{
      rc = moveToChild(pCur, get4byte(findCell(pPage, iIdx)));
    }
  }

  /* An error has occurred. Return an error code. */
  return rc;
}